

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

uint32_t __thiscall cfd::core::DescriptorNode::GetNeedArgumentNum(DescriptorNode *this)

{
  bool bVar1;
  uint32_t uVar2;
  reference this_00;
  DescriptorNode *child;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_> *__range3;
  uint32_t result;
  DescriptorNode *this_local;
  
  __range3._4_4_ = this->need_arg_num_;
  bVar1 = ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
          empty(&this->child_node_);
  if (!bVar1) {
    __end3 = ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
             begin(&this->child_node_);
    child = (DescriptorNode *)
            ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
            end(&this->child_node_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_cfd::core::DescriptorNode_*,_std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>_>
                                       *)&child), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_cfd::core::DescriptorNode_*,_std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>_>
                ::operator*(&__end3);
      uVar2 = GetNeedArgumentNum(this_00);
      __range3._4_4_ = uVar2 + __range3._4_4_;
      __gnu_cxx::
      __normal_iterator<const_cfd::core::DescriptorNode_*,_std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>_>
      ::operator++(&__end3);
    }
  }
  return __range3._4_4_;
}

Assistant:

uint32_t DescriptorNode::GetNeedArgumentNum() const {
  uint32_t result = need_arg_num_;
  if (!child_node_.empty()) {
    for (const auto& child : child_node_) {
      result += child.GetNeedArgumentNum();
    }
  }
  return result;
}